

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

int __thiscall
CVmFormatterLog::open_log_file(CVmFormatterLog *this,vm_val_t *filespec,vm_rcdesc *rc)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  err_frame_t *peVar3;
  CVmException *pCVar4;
  int iVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  undefined4 extraout_var;
  long *plVar8;
  vm_globalvar_t *pvVar9;
  CVmNetFile *nf;
  err_frame_t err_cur__;
  
  puVar6 = (undefined8 *)_ZTW11G_err_frame();
  err_cur__.prv_ = (err_frame_t *)*puVar6;
  uVar7 = _ZTW11G_err_frame();
  *(err_frame_t **)uVar7 = &err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 1) {
    err_cur__.state_ = 2;
  }
  else if (err_cur__.state_ == 0) {
    iVar5 = CVmNetFile::open((char *)filespec,(int)rc,0xe,2,"text/plain");
    nf = (CVmNetFile *)CONCAT44(extraout_var,iVar5);
    CVmObjFile::check_safety_for_open(nf,2);
    if (err_cur__.state_ != 1) goto LAB_002691e6;
    err_cur__.state_ = 2;
    if (nf != (CVmNetFile *)0x0) {
      CVmNetFile::abandon(nf);
      err_rethrow();
      goto LAB_002691e6;
    }
  }
  nf = (CVmNetFile *)0x0;
LAB_002691e6:
  peVar3 = err_cur__.prv_;
  puVar6 = (undefined8 *)_ZTW11G_err_frame();
  *puVar6 = peVar3;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    puVar6 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar6 & 2) != 0) {
      plVar8 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar8 + 0x10));
    }
    pCVar4 = err_cur__.exc_;
    plVar8 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar8 + 0x10) = pCVar4;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  iVar5 = open_log_file(this,nf);
  if (iVar5 == 0) {
    pvVar9 = this->logglob_;
    if (pvVar9 == (vm_globalvar_t *)0x0) {
      pvVar9 = CVmObjTable::create_global_var(&G_obj_table_X);
      this->logglob_ = pvVar9;
    }
    uVar2 = *(undefined4 *)&filespec->field_0x4;
    aVar1 = filespec->val;
    (pvVar9->val).typ = filespec->typ;
    *(undefined4 *)&(pvVar9->val).field_0x4 = uVar2;
    (pvVar9->val).val = aVar1;
  }
  return iVar5;
}

Assistant:

int CVmFormatterLog::open_log_file(VMG_ const vm_val_t *filespec,
                                   const struct vm_rcdesc *rc)
{
    CVmNetFile *nf = 0;
    err_try
    {
        /* create the network file descriptor */
        nf = CVmNetFile::open(vmg_ filespec, rc,
                              NETF_NEW, OSFTLOG, "text/plain");

        /* validate file safety */
        CVmObjFile::check_safety_for_open(vmg_ nf, VMOBJFILE_ACCESS_WRITE);
    }